

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlContext.cpp
# Opt level: O3

void __thiscall sf::priv::GlContext::~GlContext(GlContext *this)

{
  GlContext *pGVar1;
  
  this->_vptr_GlContext = (_func_int **)&PTR__GlContext_001d28f8;
  if ((anonymous_namespace)::GlContextImpl::sharedContext != 0) {
    pGVar1 = (GlContext *)
             ThreadLocal::getValue
                       ((ThreadLocal *)&(anonymous_namespace)::GlContextImpl::currentContext);
    if (pGVar1 == this) {
      ThreadLocal::setValue
                ((ThreadLocal *)&(anonymous_namespace)::GlContextImpl::currentContext,(void *)0x0);
    }
  }
  return;
}

Assistant:

GlContext::~GlContext()
{
    using GlContextImpl::currentContext;
    using GlContextImpl::sharedContext;

    // Deactivate the context before killing it, unless we're inside Cleanup()
    if (sharedContext)
    {
        if (this == currentContext)
            currentContext = NULL;
    }
}